

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O0

bool __thiscall Moc::parseMaybeFunction(Moc *this,ClassDef *cdef,FunctionDef *def)

{
  bool bVar1;
  byte bVar2;
  Token TVar3;
  Moc *in_RDX;
  FunctionDef *in_RSI;
  Moc *in_RDI;
  long in_FS_OFFSET;
  bool scopedFunctionName;
  bool tilde;
  QByteArray msg;
  QByteArray rawName;
  Type tempType;
  undefined5 in_stack_fffffffffffffde8;
  undefined1 in_stack_fffffffffffffded;
  undefined1 in_stack_fffffffffffffdee;
  char c;
  undefined4 in_stack_fffffffffffffdf8;
  uint uVar4;
  undefined2 in_stack_fffffffffffffdfc;
  undefined1 in_stack_fffffffffffffdfe;
  byte bVar5;
  undefined1 in_stack_fffffffffffffdff;
  Moc *this_00;
  byte local_1e1;
  undefined1 in_stack_fffffffffffffe20 [16];
  char *in_stack_fffffffffffffe38;
  QByteArray local_188 [3];
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  char *local_d8;
  char *local_d0;
  undefined1 local_c8 [48];
  byte local_98;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 *)((long)&(in_RDX->interface2IdMap).d.d.ptr + 1) = 0;
  *(undefined1 *)((long)&(in_RDX->interface2IdMap).d.d.ptr + 2) = 0;
  this_00 = in_RDI;
  do {
    bVar1 = testForFunctionModifiers
                      (in_RDX,(FunctionDef *)
                              CONCAT17(in_stack_fffffffffffffdff,
                                       CONCAT16(in_stack_fffffffffffffdfe,
                                                CONCAT24(in_stack_fffffffffffffdfc,
                                                         in_stack_fffffffffffffdf8))));
    c = true;
    if (!bVar1) {
      bVar1 = skipCxxAttributes((Moc *)CONCAT17(in_stack_fffffffffffffdff,
                                                CONCAT16(in_stack_fffffffffffffdfe,
                                                         CONCAT24(in_stack_fffffffffffffdfc,
                                                                  in_stack_fffffffffffffdf8))));
      c = true;
      if (!bVar1) {
        bVar1 = testFunctionAttribute
                          ((Moc *)CONCAT17(in_stack_fffffffffffffdff,
                                           CONCAT16(in_stack_fffffffffffffdfe,
                                                    CONCAT24(in_stack_fffffffffffffdfc,
                                                             in_stack_fffffffffffffdf8))),
                           (FunctionDef *)in_RDI);
        c = true;
        if (!bVar1) {
          c = testFunctionRevision
                        (in_RDX,(FunctionDef *)
                                CONCAT17(in_stack_fffffffffffffdff,
                                         CONCAT16(in_stack_fffffffffffffdfe,
                                                  CONCAT24(in_stack_fffffffffffffdfc,
                                                           in_stack_fffffffffffffdf8))));
        }
      }
    }
  } while ((bool)c != false);
  bVar2 = Parser::test((Parser *)
                       CONCAT17(in_stack_fffffffffffffdff,
                                CONCAT16(in_stack_fffffffffffffdfe,
                                         CONCAT24(in_stack_fffffffffffffdfc,
                                                  in_stack_fffffffffffffdf8))),
                       (Token)((ulong)in_RDI >> 0x20));
  parseType(in_stack_fffffffffffffe20._0_8_);
  Type::operator=((Type *)in_RDI,
                  (Type *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                              CONCAT15(in_stack_fffffffffffffded,
                                                       in_stack_fffffffffffffde8))));
  Type::~Type((Type *)in_RDI);
  bVar1 = QByteArray::isEmpty((QByteArray *)0x13157b);
  if (bVar1) {
    local_1e1 = 0;
  }
  else {
    bVar5 = 0;
    bVar1 = Parser::test((Parser *)
                         CONCAT17(bVar2,(uint7)CONCAT24(in_stack_fffffffffffffdfc,
                                                        in_stack_fffffffffffffdf8)),
                         (Token)((ulong)in_RDI >> 0x20));
    if (bVar1) {
      QByteArray::operator=((QByteArray *)&(in_RDX->includePath).d.size,(QByteArray *)in_RDX);
      bVar5 = (*(byte *)&(in_RDX->super_Parser).includes.d.ptr >> 1 & 1) != 0;
      bVar1 = ::operator==((QByteArray *)in_RDX,
                           (QByteArray *)
                           CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                                  in_stack_fffffffffffffdf8))));
      if (!bVar1) {
        local_1e1 = 0;
        goto LAB_00131acb;
      }
      *(byte *)((long)&(in_RDX->metaTypes).d.d + 5) = bVar2 & 1;
      *(byte *)((long)&(in_RDX->metaTypes).d.d + 4) = (bVar2 ^ 0xff) & 1;
      Type::Type((Type *)in_RDI);
      Type::operator=((Type *)in_RDI,
                      (Type *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                                  CONCAT15(in_stack_fffffffffffffded,
                                                           in_stack_fffffffffffffde8))));
      Type::~Type((Type *)in_RDI);
    }
    else {
      if (((((ulong)(in_RDX->metaTypes).d.d & 0x100) != 0) ||
          (((ulong)(in_RDX->metaTypes).d.d & 0x10000) != 0)) ||
         (((ulong)(in_RDX->interface2IdMap).d.d.ptr & 0x100000000000000) != 0)) {
        do {
          bVar1 = testForFunctionModifiers
                            (in_RDX,(FunctionDef *)
                                    CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc
                                                                           ,
                                                  in_stack_fffffffffffffdf8))));
        } while (bVar1);
      }
      memset(local_c8,0xaa,0x40);
      parseType(in_stack_fffffffffffffe20._0_8_);
      while( true ) {
        bVar1 = QByteArray::isEmpty((QByteArray *)0x1316d4);
        in_stack_fffffffffffffdee = false;
        if (!bVar1) {
          TVar3 = Parser::lookup(&this_00->super_Parser,(int)((ulong)in_RSI >> 0x20));
          in_stack_fffffffffffffdee = TVar3 != LPAREN;
        }
        if ((bool)in_stack_fffffffffffffdee == false) break;
        bVar1 = testFunctionAttribute
                          (in_RDI,(Token)(in_RDX->super_Parser).includes.d.size,
                           (FunctionDef *)in_RDX);
        if (!bVar1) {
          local_d0 = "Q_SIGNAL";
          bVar1 = ::operator==((QByteArray *)in_RDX,
                               (char **)CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_fffffffffffffdfc,
                                                  in_stack_fffffffffffffdf8))));
          if (bVar1) {
            *(undefined1 *)((long)&(in_RDX->metaTypes).d.d + 2) = 1;
          }
          else {
            local_d8 = "Q_SLOT";
            bVar1 = ::operator==((QByteArray *)in_RDX,
                                 (char **)CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(
                                                  in_stack_fffffffffffffdfc,
                                                  in_stack_fffffffffffffdf8))));
            if (bVar1) {
              *(undefined1 *)((long)&(in_RDX->metaTypes).d.d + 1) = 1;
            }
            else {
              bVar1 = QByteArray::isEmpty((QByteArray *)0x1317a1);
              if (!bVar1) {
                QByteArray::operator+=((QByteArray *)in_RDI,c);
              }
              QByteArray::operator+=
                        ((QByteArray *)in_RDI,
                         (QByteArray *)
                         CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                             CONCAT15(in_stack_fffffffffffffded,
                                                      in_stack_fffffffffffffde8))));
            }
          }
        }
        Type::operator=((Type *)in_RDI,
                        (Type *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                                    CONCAT15(in_stack_fffffffffffffded,
                                                             in_stack_fffffffffffffde8))));
        parseType(in_stack_fffffffffffffe20._0_8_);
        Type::operator=((Type *)in_RDI,
                        (Type *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                                    CONCAT15(in_stack_fffffffffffffded,
                                                             in_stack_fffffffffffffde8))));
        Type::~Type((Type *)in_RDI);
      }
      bVar1 = Parser::test((Parser *)
                           CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                                  in_stack_fffffffffffffdf8))),
                           (Token)((ulong)in_RDI >> 0x20));
      if (bVar1) {
        QByteArray::operator=((QByteArray *)&(in_RDX->includePath).d.size,(QByteArray *)local_c8);
        bVar5 = (local_98 >> 1 & 1) != 0;
      }
      else {
        local_1e1 = 0;
      }
      uVar4 = (uint)!bVar1;
      Type::~Type((Type *)in_RDI);
      if (uVar4 != 0) goto LAB_00131acb;
      in_stack_fffffffffffffdf8 = 0;
    }
    if (*(int *)((long)&(in_RDX->super_Parser).includes.d.size + 4) == 1) {
      local_130 = &DAT_aaaaaaaaaaaaaaaa;
      local_128 = &DAT_aaaaaaaaaaaaaaaa;
      local_120 = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray
                ((QByteArray *)in_RDI,
                 (QByteArray *)
                 CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                     CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8)))
                );
      QByteArray::QByteArray(local_188,"void",-1);
      Type::Type((Type *)in_RDI,
                 (QByteArray *)
                 CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                     CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8)))
                );
      Type::operator=((Type *)in_RDI,
                      (Type *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                                  CONCAT15(in_stack_fffffffffffffded,
                                                           in_stack_fffffffffffffde8))));
      Type::~Type((Type *)in_RDI);
      QByteArray::~QByteArray((QByteArray *)0x131943);
      QByteArray::operator=((QByteArray *)&(in_RDX->super_Parser).index,(QByteArray *)&local_130);
      QByteArray::~QByteArray((QByteArray *)0x131966);
    }
    normalizeType((QByteArray *)
                  CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                         in_stack_fffffffffffffdf8))));
    QByteArray::operator=
              ((QByteArray *)in_RDI,
               (QByteArray *)
               CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                   CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8))));
    QByteArray::~QByteArray((QByteArray *)0x131992);
    bVar1 = Parser::test((Parser *)
                         CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                                in_stack_fffffffffffffdf8))),
                         (Token)((ulong)in_RDI >> 0x20));
    if (!bVar1) {
      parseFunctionArguments(this_00,in_RSI);
      bVar1 = Parser::test((Parser *)
                           CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                                  in_stack_fffffffffffffdf8))),
                           (Token)((ulong)in_RDI >> 0x20));
      if (!bVar1) {
        local_1e1 = 0;
        goto LAB_00131acb;
      }
    }
    bVar1 = Parser::test((Parser *)
                         CONCAT17(bVar2,CONCAT16(bVar5,CONCAT24(in_stack_fffffffffffffdfc,
                                                                in_stack_fffffffffffffdf8))),
                         (Token)((ulong)in_RDI >> 0x20));
    *(bool *)&(in_RDX->interface2IdMap).d.d.ptr = bVar1;
    if (((bVar5 & 1) == 0) ||
       (((((ulong)(in_RDX->metaTypes).d.d & 0x10000) == 0 &&
         (((ulong)(in_RDX->metaTypes).d.d & 0x100) == 0)) &&
        (((ulong)(in_RDX->interface2IdMap).d.d.ptr & 0x100000000000000) == 0)))) {
      local_1e1 = 1;
    }
    else {
      ::operator+((char (*) [34])in_RDI,
                  (QByteArray *)
                  CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                      CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8))
                          ));
      ::operator+((QStringBuilder<const_char_(&)[34],_QByteArray_&> *)in_RDI,
                  (char (*) [59])
                  CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                      CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8))
                          ));
      ::QStringBuilder::operator_cast_to_QByteArray
                ((QStringBuilder<QStringBuilder<const_char_(&)[34],_QByteArray_&>,_const_char_(&)[59]>
                  *)CONCAT17(c,CONCAT16(in_stack_fffffffffffffdee,
                                        CONCAT15(in_stack_fffffffffffffded,in_stack_fffffffffffffde8
                                                ))));
      QByteArray::constData((QByteArray *)0x131aa0);
      Parser::warning(&in_RDI->super_Parser,in_stack_fffffffffffffe38);
      local_1e1 = 0;
      QByteArray::~QByteArray((QByteArray *)0x131ac4);
    }
  }
LAB_00131acb:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_1e1 & 1);
}

Assistant:

bool Moc::parseMaybeFunction(const ClassDef *cdef, FunctionDef *def)
{
    def->isVirtual = false;
    def->isStatic = false;
    //skip modifiers and attributes
    while (testForFunctionModifiers(def)
        || skipCxxAttributes() || testFunctionAttribute(def) || testFunctionRevision(def)) {}
    bool tilde = test(TILDE);
    def->type = parseType();
    if (def->type.name.isEmpty())
        return false;
    bool scopedFunctionName = false;
    if (test(LPAREN)) {
        def->name = def->type.name;
        scopedFunctionName = def->type.isScoped;
        if (def->name == cdef->classname) {
            def->isDestructor = tilde;
            def->isConstructor = !tilde;
            def->type = Type();
        } else {
            // missing type name? => Skip
            return false;
        }
    } else {
        // ### TODO: The condition before testForFunctionModifiers shoulnd't be necessary,
        // but otherwise we end up with misparses
        if (def->isSlot || def->isSignal || def->isInvokable)
            while (testForFunctionModifiers(def)) {}
        Type tempType = parseType();
        while (!tempType.name.isEmpty() && lookup() != LPAREN) {
            if (testFunctionAttribute(def->type.firstToken, def))
                ; // fine
            else if (def->type.name == "Q_SIGNAL")
                def->isSignal = true;
            else if (def->type.name == "Q_SLOT")
                def->isSlot = true;
            else {
                if (!def->tag.isEmpty())
                    def->tag += ' ';
                def->tag += def->type.name;
            }
            def->type = tempType;
            tempType = parseType();
        }
        if (!test(LPAREN))
            return false;
        def->name = tempType.name;
        scopedFunctionName = tempType.isScoped;
    }

    // we don't support references as return types, it's too dangerous
    if (def->type.referenceType == Type::Reference) {
        QByteArray rawName = def->type.rawName;
        def->type = Type("void");
        def->type.rawName = rawName;
    }

    def->normalizedType = normalizeType(def->type.name);

    if (!test(RPAREN)) {
        parseFunctionArguments(def);
        if (!test(RPAREN))
            return false;
    }
    def->isConst = test(CONST);
    if (scopedFunctionName
        && (def->isSignal || def->isSlot || def->isInvokable)) {
        const QByteArray msg = "parsemaybe: Function declaration " + def->name
                + " contains extra qualification. Ignoring as signal or slot.";
        warning(msg.constData());
        return false;
    }
    return true;
}